

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::CreateFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  string *psVar4;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *moddir_flag;
  string *default_mod_dir;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  char *prop;
  string target_mod_dir;
  string *working_dir_local;
  cmGeneratorTarget *this_local;
  string *mod_dir;
  
  target_mod_dir.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&prop);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Fortran_MODULE_DIRECTORY",&local_71);
  pcVar2 = GetProperty(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    moddir_flag = (char *)cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                    (this->LocalGenerator);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            moddir_flag,working_dir);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&prop,(string *)moddir_flag);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&prop,pcVar2);
  }
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_Fortran_MODDIR_FLAG",&local_b9);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pcVar2;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (local_98 != (char *)0x0)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&prop);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&prop);
    }
    else {
      psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&prop);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  }
  target_mod_dir.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&prop);
  if ((target_mod_dir.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CreateFortranModuleDirectory(
  std::string const& working_dir) const
{
  std::string mod_dir;
  std::string target_mod_dir;
  if (const char* prop = this->GetProperty("Fortran_MODULE_DIRECTORY")) {
    target_mod_dir = prop;
  } else {
    std::string const& default_mod_dir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    if (default_mod_dir != working_dir) {
      target_mod_dir = default_mod_dir;
    }
  }
  const char* moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if (!target_mod_dir.empty() && moddir_flag) {
    // Compute the full path to the module directory.
    if (cmSystemTools::FileIsFullPath(target_mod_dir)) {
      // Already a full path.
      mod_dir = target_mod_dir;
    } else {
      // Interpret relative to the current output directory.
      mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
      mod_dir += "/";
      mod_dir += target_mod_dir;
    }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
  }
  return mod_dir;
}